

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OverviewExamples.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Sandwich *sandwich)

{
  ostream *poVar1;
  string *in_RSI;
  ostream *in_RDI;
  StringList *in_stack_00000148;
  string local_60 [48];
  string local_30 [32];
  string *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::operator<<(in_RDI,"sandwich {\n");
  poVar1 = std::operator<<(local_8,"    bread: \"");
  poVar1 = std::operator<<(poVar1,local_10);
  std::operator<<(poVar1,"\",\n");
  poVar1 = std::operator<<(local_8,"    condiments: ");
  StringList::toString_abi_cxx11_(in_stack_00000148);
  poVar1 = std::operator<<(poVar1,local_30);
  std::operator<<(poVar1,",\n");
  std::__cxx11::string::~string(local_30);
  poVar1 = std::operator<<(local_8,"    fillings: ");
  StringList::toString_abi_cxx11_(in_stack_00000148);
  poVar1 = std::operator<<(poVar1,local_60);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_60);
  std::operator<<(local_8,"}");
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Sandwich& sandwich)
{
    os << "sandwich {\n";
    os << "    bread: \"" << sandwich.bread << "\",\n";
    os << "    condiments: " << sandwich.condiments.toString() << ",\n";
    os << "    fillings: " << sandwich.fillings.toString() << "\n";
    os << "}";
    return os;
}